

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_radix_tree.hpp
# Opt level: O3

coro_result * __thiscall
cinatra::radix_tree::get_coro
          (coro_result *__return_storage_ptr__,radix_tree *this,string *path,string *method)

{
  char cVar1;
  int iVar2;
  pointer psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined8 uVar4;
  int iVar5;
  radix_tree_node *__tmp;
  _Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
  *p_Var6;
  int start;
  bool bVar7;
  shared_ptr<cinatra::radix_tree_node> root;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  element_type *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  _Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
  *local_e0;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8;
  string *local_b0;
  undefined1 local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Any_data local_58;
  undefined4 local_48;
  _Invoker_type local_40;
  _Alloc_hider _Stack_38;
  
  local_68._M_allocated_capacity = (size_type)&_Stack_38;
  local_68._8_8_ = 1;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0x3f800000;
  local_40 = (_Invoker_type)0x0;
  _Stack_38._M_p = (pointer)0x0;
  local_f0 = (this->root).super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  local_e8._M_pi =
       (this->root).super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8._M_pi)->_M_use_count = (local_e8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8._M_pi)->_M_use_count = (local_e8._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (int)path->_M_string_length;
  local_e0 = (_Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
              *)__return_storage_ptr__;
  local_b8._M_p = (pointer)this;
  local_b0 = method;
  if (0 < iVar2) {
    start = 0;
    do {
      if ((local_f0->indices)._M_string_length == 0) {
LAB_00152dfb:
        *(long *)(local_e0 + 0x20) = 0;
        *(_Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
          **)local_e0 = local_e0 + 0x30;
        *(size_type *)(local_e0 + 8) = 1;
        *(_Hash_node_base **)(local_e0 + 0x10) = (_Hash_node_base *)0x0;
        *(size_type *)(local_e0 + 0x18) = 0;
        *(undefined4 *)(local_e0 + 0x20) = 0x3f800000;
        *(size_t *)(local_e0 + 0x28) = 0;
        *(__node_base_ptr *)(local_e0 + 0x30) = (__node_base_ptr)0x0;
        *(long *)(local_e0 + 0x38) = 0;
        *(long *)(local_e0 + 0x40) = 0;
        *(_Manager_type *)(local_e0 + 0x48) = (_Manager_type)0x0;
        *(_Invoker_type *)(local_e0 + 0x50) = (_Invoker_type)0x0;
        local_e0[0x58] =
             (_Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
              )0x0;
        p_Var6 = local_e0;
        goto LAB_00152ed8;
      }
      cVar1 = *(local_f0->indices)._M_dataplus._M_p;
      if (cVar1 != ':') {
        if (cVar1 != '*') {
          radix_tree_node::get_child((radix_tree_node *)local_d8,(char)local_f0);
          uVar4 = local_d8._8_8_;
          local_f0 = (element_type *)local_d8._0_8_;
          this_00._M_pi = local_e8._M_pi;
          local_d8._0_8_ = (element_type *)0x0;
          local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
          if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if (local_f0 != (element_type *)0x0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,path,(long)start,*(size_type *)((long)local_f0 + 8));
            uVar4 = local_d8._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ ==
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_f0 + 8)) {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                bVar7 = false;
              }
              else {
                iVar5 = bcmp((void *)local_d8._0_8_,*(void **)local_f0,local_d8._8_8_);
                bVar7 = iVar5 != 0;
              }
            }
            else {
              bVar7 = true;
            }
            if ((element_type *)uVar4 != (element_type *)(local_d8 + 0x10)) {
              operator_delete((void *)uVar4,local_d8._16_8_ + 1);
            }
            if (!bVar7) {
              start = start + (int)*(size_type *)((long)local_f0 + 8);
              goto LAB_00152d73;
            }
          }
          goto LAB_00152dfb;
        }
        psVar3 = (local_f0->children).
                 super__Vector_base<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_f0 = (psVar3->super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_e8,
                   &(psVar3->
                    super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   path,(long)start,0xffffffffffffffff);
        std::__detail::
        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)local_68._M_local_buf,&local_f0->path);
        get_coro();
        break;
      }
      psVar3 = (local_f0->children).
               super__Vector_base<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_f0 = (psVar3->super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_e8,
                 &(psVar3->super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_refcount);
      iVar5 = find_pos((radix_tree *)local_b8._M_p,path,'/',start);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_88,path,(long)start,(long)(iVar5 - start));
      std::__detail::
      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)local_68._M_local_buf,&local_f0->path);
      get_coro();
      start = iVar5;
LAB_00152d73:
    } while (start < iVar2);
  }
  radix_tree_node::get_coro_handler
            ((function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
              *)local_a8,local_f0,local_b0);
  p_Var6 = local_e0;
  std::
  _Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
  ::
  _Tuple_impl<std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&,void>
            (local_e0,(function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                       *)local_a8,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_68);
  p_Var6[0x58] = (_Tuple_impl<1ul,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                  )0x1;
  if ((_func_void *)local_a8._16_8_ != (_func_void *)0x0) {
    (*(code *)local_a8._16_8_)(local_a8,local_a8,3);
  }
LAB_00152ed8:
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_68);
  return (coro_result *)p_Var6;
}

Assistant:

coro_result get_coro(const std::string &path, const std::string &method) {
    std::unordered_map<std::string, std::string> params;
    auto root = this->root;

    int i = 0, n = path.size(), p;

    while (i < n) {
      if (root->indices.empty())
        return coro_result();

      if (root->indices[0] == type_colon) {
        root = root->children[0];

        p = find_pos(path, type_slash, i);
        params[root->path] = path.substr(i, p - i);
        i = p;
      }
      else if (root->indices[0] == type_asterisk) {
        root = root->children[0];
        params[root->path] = path.substr(i);
        break;
      }
      else {
        root = root->get_child(path[i]);
        if (!root || path.substr(i, root->path.size()) != root->path)
          return coro_result();
        i += root->path.size();
      }
    }

    return coro_result{true, root->get_coro_handler(method), params};
  }